

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall
embree::Texture::Texture(Texture *this,uint width,uint height,Format format,char *in)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  long in_R8;
  size_t i;
  size_t in_stack_ffffffffffffffa8;
  uint uVar4;
  Format in_stack_ffffffffffffffc0;
  ulong local_38;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  uVar2 = getFormatBytesPerTexel(in_stack_ffffffffffffffc0);
  in_RDI[3] = uVar2;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  bVar1 = isPowerOf2(in_ESI);
  if (bVar1) {
    uVar2 = in_ESI - 1;
  }
  else {
    uVar2 = 0;
  }
  in_RDI[4] = uVar2;
  bVar1 = isPowerOf2(in_EDX);
  if (bVar1) {
    uVar4 = in_EDX - 1;
  }
  else {
    uVar4 = 0;
  }
  in_RDI[5] = uVar4;
  pvVar3 = alignedUSMMalloc(CONCAT44(uVar2,uVar4),in_stack_ffffffffffffffa8,DEFAULT);
  *(void **)(in_RDI + 6) = pvVar3;
  if (in_R8 == 0) {
    memset(*(void **)(in_RDI + 6),0,(ulong)(in_RDI[3] * in_ESI * in_EDX));
  }
  else {
    for (local_38 = 0; local_38 < in_RDI[3] * in_ESI * in_EDX; local_38 = local_38 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 6) + local_38) = *(undefined1 *)(in_R8 + local_38);
    }
  }
  return;
}

Assistant:

Texture::Texture (unsigned width, unsigned height, const Format format, const char* in)
    : width(width), height(height), format(format), bytesPerTexel(getFormatBytesPerTexel(format)), width_mask(0), height_mask(0), data(nullptr)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(bytesPerTexel*width*height,16);
    if (in) {
      for (size_t i=0; i<bytesPerTexel*width*height; i++)
	((char*)data)[i] = in[i];
    }
    else {
      memset(data,0 ,bytesPerTexel*width*height);
    }   
  }